

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void ConvexDecomposition::ReleaseHull(PHullResult *result)

{
  free(result->mIndices);
  result->mVcount = 0;
  result->mIndexCount = 0;
  result->mVertices = (float *)0x0;
  result->mIndices = (uint *)0x0;
  return;
}

Assistant:

void ReleaseHull(PHullResult &result)
{
	if ( result.mIndices )
  {
	  free(result.mIndices);
	}

	result.mVcount = 0;
	result.mIndexCount = 0;
	result.mIndices = 0;
	result.mVertices = 0;
	result.mIndices  = 0;
}